

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

jx9_io_stream * jx9VmGetStreamDevice(jx9_vm *pVm,char **pzDevice,int nByte)

{
  char *pcVar1;
  char cVar2;
  void *pvVar3;
  jx9_io_stream *pjVar4;
  uint uVar5;
  sxu32 sVar6;
  int iVar7;
  ushort **ppuVar8;
  ulong uVar9;
  char *pcVar10;
  ulong uVar11;
  char *pcVar12;
  char *local_48;
  
  pcVar12 = *pzDevice;
  uVar5 = 0;
  pcVar10 = pcVar12;
  while( true ) {
    if (pcVar12 + nByte <= pcVar10) {
      return pVm->pDefStream;
    }
    if ((((pcVar10 < pcVar12 + (long)nByte + -3) && (*pcVar10 == ':')) && (pcVar10[1] == '/')) &&
       (pcVar10[2] == '/')) break;
    pcVar10 = pcVar10 + 1;
    uVar5 = uVar5 + 1;
  }
  uVar11 = (ulong)uVar5;
  pcVar1 = pcVar12 + uVar11;
  while (((local_48 = pcVar1, (uint)uVar11 != 0 &&
          (cVar2 = *pcVar12, local_48 = pcVar12, (ulong)(long)cVar2 < 0xffffffffffffffc0)) &&
         (ppuVar8 = __ctype_b_loc(), (*(byte *)((long)*ppuVar8 + (long)cVar2 * 2 + 1) & 0x20) != 0))
        ) {
    pcVar12 = pcVar12 + 1;
    uVar11 = uVar11 - 1;
  }
  uVar5 = ~(uint)uVar11;
  do {
    if (uVar11 == 0) {
      uVar11 = 0;
      goto LAB_00129073;
    }
    cVar2 = local_48[uVar11 - 1];
    if (0xffffffffffffffbf < (ulong)(long)cVar2) goto LAB_00129073;
    ppuVar8 = __ctype_b_loc();
    uVar5 = uVar5 + 1;
    uVar11 = uVar11 - 1;
  } while ((*(byte *)((long)*ppuVar8 + (long)cVar2 * 2 + 1) & 0x20) != 0);
  uVar11 = (ulong)-uVar5;
LAB_00129073:
  pvVar3 = (pVm->aIOstream).pBase;
  uVar5 = (pVm->aIOstream).nUsed;
  uVar9 = 0;
  do {
    if (uVar5 == uVar9) {
      return (jx9_io_stream *)0x0;
    }
    pjVar4 = *(jx9_io_stream **)((long)pvVar3 + uVar9 * 8);
    pcVar12 = pjVar4->zName;
    sVar6 = SyStrlen(pcVar12);
    iVar7 = (sxu32)uVar11 - sVar6;
    if (iVar7 == 0) {
      iVar7 = SyStrnicmp(local_48,pcVar12,(sxu32)uVar11);
    }
    uVar9 = uVar9 + 1;
  } while (iVar7 != 0);
  *pzDevice = pcVar10 + 3;
  return pjVar4;
}

Assistant:

JX9_PRIVATE const jx9_io_stream * jx9VmGetStreamDevice(
	jx9_vm *pVm,           /* Target VM */
	const char **pzDevice, /* Full path, URI, ... */
	int nByte              /* *pzDevice length*/
	)
{
	const char *zIn, *zEnd, *zCur, *zNext;
	jx9_io_stream **apStream, *pStream;
	SyString sDev, sCur;
	sxu32 n, nEntry;
	int rc;
	/* Check if a scheme [i.e: file://, http://, zip://...] is available */
	zNext = zCur = zIn = *pzDevice;
	zEnd = &zIn[nByte];
	while( zIn < zEnd ){
		if( zIn < &zEnd[-3]/*://*/ && zIn[0] == ':' && zIn[1] == '/' && zIn[2] == '/' ){
			/* Got one */
			zNext = &zIn[sizeof("://")-1];
			break;
		}
		/* Advance the cursor */
		zIn++;
	}
	if( zIn >= zEnd ){
		/* No such scheme, return the default stream */
		return pVm->pDefStream;
	}
	SyStringInitFromBuf(&sDev, zCur, zIn-zCur);
	/* Remove leading and trailing white spaces */
	SyStringFullTrim(&sDev);
	/* Perform a linear lookup on the installed stream devices */
	apStream = (jx9_io_stream **)SySetBasePtr(&pVm->aIOstream);
	nEntry = SySetUsed(&pVm->aIOstream);
	for( n = 0 ; n < nEntry ; n++ ){
		pStream = apStream[n];
		SyStringInitFromBuf(&sCur, pStream->zName, SyStrlen(pStream->zName));
		/* Perfrom a case-insensitive comparison */
		rc = SyStringCmp(&sDev, &sCur, SyStrnicmp);
		if( rc == 0 ){
			/* Stream device found */
			*pzDevice = zNext;
			return pStream;
		}
	}
	/* No such stream, return NULL */
	return 0;
}